

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.cpp
# Opt level: O0

size_t qHash(double key,size_t seed)

{
  long lVar1;
  size_t sVar2;
  size_t in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  size_t k;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = QHashPrivate::hash((size_t)(in_XMM0_Qa + 0.0),in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return sVar2;
  }
  __stack_chk_fail();
}

Assistant:

size_t qHash(double key, size_t seed) noexcept
{
    // ensure -0 gets mapped to 0
    key += 0.0;
    if constexpr (sizeof(double) == sizeof(size_t)) {
        size_t k;
        memcpy(&k, &key, sizeof(double));
        return QHashPrivate::hash(k, seed);
    } else {
        return murmurhash(&key, sizeof(key), seed);
    }
}